

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_free_heap(Integer memhandle)

{
  Boolean BVar1;
  AD *pAVar2;
  AD *in_RDI;
  AD *ad;
  char *in_stack_00000020;
  BlockLocation in_stack_0000002c;
  AD **in_stack_00000030;
  Integer in_stack_00000038;
  AD *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff8;
  
  ma_stats.calls[3] = ma_stats.calls[3] + 1;
  BVar1 = mh2ad(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  if (BVar1 == 0) {
    BVar1 = 0;
  }
  else {
    if (ma_trace != 0) {
      printf("MA: freeing \'%s\'\n",in_stack_ffffffffffffffe8->name);
    }
    pAVar2 = list_delete(in_RDI,(AD **)in_stack_ffffffffffffffe8);
    if (pAVar2 == in_stack_ffffffffffffffe8) {
      ma_stats.hblocks = ma_stats.hblocks - 1;
      ma_stats.hbytes = ma_stats.hbytes - in_stack_ffffffffffffffe8->nbytes;
      block_free_heap((AD *)CONCAT44(ad._4_4_,(ErrorType)ad));
      ma_table_deallocate(0x1d76c3);
      BVar1 = 1;
    }
    else {
      sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not on heap used list",in_RDI,
              in_stack_ffffffffffffffe8->name);
      ma_error(ad._4_4_,(ErrorType)ad,in_stack_fffffffffffffff8,(char *)in_RDI);
      BVar1 = 0;
    }
  }
  return BVar1;
}

Assistant:

public Boolean MA_free_heap(Integer memhandle) /* the block to deallocate */
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_free_heap]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Heap, "MA_free_heap"))
        return MA_FALSE;

    if (ma_trace) 
    (void)printf("MA: freeing '%s'\n", ad->name);

    /* delete block from used list */
    if (list_delete(ad, &ma_hused) != ad)
    {
        (void)sprintf(ma_ebuf,
            "memhandle %ld (name: '%s') not on heap used list",
            (size_t)memhandle, ad->name);
        ma_error(EL_Nonfatal, ET_Internal, "MA_free_heap", ma_ebuf);
        return MA_FALSE;
    }

#ifdef STATS
    ma_stats.hblocks--;
    ma_stats.hbytes -= ad->nbytes;
#endif /* STATS */

    /* reclaim the deallocated block */
    block_free_heap(ad);

    /* free memhandle */
    ma_table_deallocate(memhandle);

    /* success */
    return MA_TRUE;
}